

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getHandle(TestMoreStuffImpl *this,GetHandleContext context)

{
  undefined1 local_a0 [64];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_&> local_20;
  TestMoreStuffImpl *this_local;
  GetHandleContext context_local;
  
  local_20.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
                *)&this_local,&local_60);
  kj::heap<capnp::_::HandleImpl,int&>((kj *)local_a0,(int *)context.hook[2]._vptr_CallContextHook);
  capnproto_test::capnp::test::TestHandle::Client::Client<capnp::_::HandleImpl,void>
            ((Client *)(local_a0 + 0x10),(Own<capnp::_::HandleImpl,_std::nullptr_t> *)local_a0);
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Builder::setHandle
            (&local_48,(Client *)(local_a0 + 0x10));
  capnproto_test::capnp::test::TestHandle::Client::~Client((Client *)(local_a0 + 0x10));
  kj::Own<capnp::_::HandleImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::HandleImpl,_std::nullptr_t> *)local_a0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getHandle(GetHandleContext context) {
  context.getResults().setHandle(kj::heap<HandleImpl>(handleCount));
  return kj::READY_NOW;
}